

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_map.cpp
# Opt level: O3

int main(void)

{
  _Base_ptr *pp_Var1;
  _Rb_tree_header *p_Var2;
  _Rb_tree_color _Var3;
  pointer pbVar4;
  pointer pcVar5;
  ostream *poVar6;
  _Base_ptr p_Var7;
  long lVar8;
  _Rb_tree_node_base *p_Var9;
  _Rb_tree_node_base *p_Var10;
  _Rb_tree_node_base *p_Var11;
  int iVar12;
  _Rb_tree_node_base *p_Var13;
  int iVar14;
  SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pSVar15;
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  e_1;
  iterator iter;
  multimap<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  lolz;
  skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
  aDict;
  undefined1 local_b28 [8];
  _Alloc_hider local_b20;
  SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_b18;
  char local_b10 [16];
  iterator local_b00;
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_ae8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ab8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a58;
  skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
  local_a38;
  
  skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
  ::skiplist(&local_a38);
  local_a58._M_dataplus._M_p = (pointer)&local_a58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a58,"hello","");
  skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
  ::insert(&local_a38,10,&local_a58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58._M_dataplus._M_p != &local_a58.field_2) {
    operator_delete(local_a58._M_dataplus._M_p);
  }
  local_a78._M_dataplus._M_p = (pointer)&local_a78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a78,"jello","");
  skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
  ::insert(&local_a38,0x14,&local_a78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._M_dataplus._M_p != &local_a78.field_2) {
    operator_delete(local_a78._M_dataplus._M_p);
  }
  local_a98._M_dataplus._M_p = (pointer)&local_a98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a98,"yello","");
  skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
  ::insert(&local_a38,0x14,&local_a98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a98._M_dataplus._M_p != &local_a98.field_2) {
    operator_delete(local_a98._M_dataplus._M_p);
  }
  local_ab8._M_dataplus._M_p = (pointer)&local_ab8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ab8,"fello","");
  skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
  ::insert(&local_a38,0x28,&local_ab8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ab8._M_dataplus._M_p != &local_ab8.field_2) {
    operator_delete(local_ab8._M_dataplus._M_p);
  }
  operator<<((ostream *)&std::cout,&local_a38);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"SKIPLIST:\n",10);
  if ((local_a38.key.
       super__Vector_base<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       local_a38.key.
       super__Vector_base<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     (pSVar15 = (*local_a38.key.
                  super__Vector_base<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
                  ._M_impl.super__Vector_impl_data._M_start)->next,
     pSVar15 !=
     (SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      *)0x0)) {
    iVar14 = pSVar15->count + -1;
    pp_Var1 = &local_ae8._M_impl.super__Rb_tree_header._M_header._M_parent;
    iVar12 = iVar14;
    do {
      pbVar4 = (pSVar15->valz).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pcVar5 = pbVar4[iVar12 - iVar14]._M_dataplus._M_p;
      local_ae8._M_impl._0_8_ = pp_Var1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_ae8,pcVar5,pcVar5 + pbVar4[iVar12 - iVar14]._M_string_length);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_ae8._M_impl._0_8_,
                          CONCAT44(local_ae8._M_impl.super__Rb_tree_header._M_header._4_4_,
                                   local_ae8._M_impl.super__Rb_tree_header._M_header._M_color));
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      if ((_Base_ptr *)local_ae8._M_impl._0_8_ != pp_Var1) {
        operator_delete((void *)local_ae8._M_impl._0_8_);
      }
      if (iVar14 == 0) {
        pSVar15 = pSVar15->next;
        if (pSVar15 ==
            (SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x0) {
          pSVar15 = (SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x0;
          iVar14 = 0;
        }
        else {
          iVar14 = pSVar15->count + -1;
          iVar12 = iVar14;
        }
      }
      else {
        iVar14 = iVar14 + -1;
      }
    } while ((pSVar15 !=
              (SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x0) || (iVar14 != 0));
  }
  p_Var2 = &local_ae8._M_impl.super__Rb_tree_header;
  local_ae8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_ae8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Rb_tree_node_base *)0x0;
  local_ae8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b28._0_4_ = 10;
  local_b20._M_p = local_b10;
  local_ae8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_ae8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b20,"hello","");
  std::
  _Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
  ::_M_insert_equal<std::pair<int_const,std::__cxx11::string>>
            ((_Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
              *)&local_ae8,
             (pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_b28);
  if (local_b20._M_p != local_b10) {
    operator_delete(local_b20._M_p);
  }
  local_b28._0_4_ = 0x14;
  local_b20._M_p = local_b10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b20,"jello","");
  std::
  _Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
  ::_M_insert_equal<std::pair<int_const,std::__cxx11::string>>
            ((_Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
              *)&local_ae8,
             (pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_b28);
  if (local_b20._M_p != local_b10) {
    operator_delete(local_b20._M_p);
  }
  local_b28._0_4_ = 0x14;
  local_b20._M_p = local_b10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b20,"yello","");
  std::
  _Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
  ::_M_insert_equal<std::pair<int_const,std::__cxx11::string>>
            ((_Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
              *)&local_ae8,
             (pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_b28);
  if (local_b20._M_p != local_b10) {
    operator_delete(local_b20._M_p);
  }
  local_b28._0_4_ = 0x28;
  local_b20._M_p = local_b10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b20,"fello","");
  std::
  _Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
  ::_M_insert_equal<std::pair<int_const,std::__cxx11::string>>
            ((_Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
              *)&local_ae8,
             (pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_b28);
  if (local_b20._M_p != local_b10) {
    operator_delete(local_b20._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"MULTISET:\n",10);
  if ((_Rb_tree_header *)local_ae8._M_impl.super__Rb_tree_header._M_header._M_left != p_Var2) {
    p_Var7 = local_ae8._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_b28._0_4_ = p_Var7[1]._M_color;
      local_b20._M_p = local_b10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b20,p_Var7[1]._M_parent,
                 (long)&(p_Var7[1]._M_parent)->_M_color + (long)&(p_Var7[1]._M_left)->_M_color);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_b28._0_4_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_b20._M_p,(long)local_b18);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      if (local_b20._M_p != local_b10) {
        operator_delete(local_b20._M_p);
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != &local_ae8._M_impl.super__Rb_tree_header);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"MULTISET:\n",10);
  p_Var13 = &local_ae8._M_impl.super__Rb_tree_header._M_header;
  p_Var11 = p_Var13;
  p_Var7 = local_ae8._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (local_ae8._M_impl.super__Rb_tree_header._M_header._M_parent != (_Rb_tree_node_base *)0x0) {
    do {
      p_Var9 = p_Var7;
      p_Var10 = p_Var11;
      _Var3 = p_Var9[1]._M_color;
      p_Var11 = p_Var9;
      if ((int)_Var3 < 0x14) {
        p_Var11 = p_Var10;
      }
      p_Var7 = (&p_Var9->_M_left)[(int)_Var3 < 0x14];
    } while ((&p_Var9->_M_left)[(int)_Var3 < 0x14] != (_Base_ptr)0x0);
    if (p_Var11 != p_Var13) {
      if ((int)_Var3 < 0x14) {
        p_Var9 = p_Var10;
      }
      if ((int)p_Var9[1]._M_color < 0x15) {
        p_Var13 = p_Var11;
      }
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Found: ",7);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,p_Var13[1]._M_color);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,(char *)p_Var13[1]._M_parent,(long)p_Var13[1]._M_left);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  lVar8 = std::_Rb_tree_increment(p_Var13);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Next: ",6);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*(int *)(lVar8 + 0x20));
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,*(char **)(lVar8 + 0x28),*(long *)(lVar8 + 0x30));
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Count: ",7);
  local_b28._0_4_ = 0x14;
  std::
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::count(&local_ae8,(key_type *)local_b28);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"SKIPLIST:\n",10);
  skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
  ::find(&local_b00,&local_a38,0x14);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Found: ",7);
  pbVar4 = ((local_b00.node)->valz).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,
                      pbVar4[(long)local_b00.node_count_ref_ - (long)local_b00.node_count_].
                      _M_dataplus._M_p,
                      pbVar4[(long)local_b00.node_count_ref_ - (long)local_b00.node_count_].
                      _M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Next: ",6);
  if (local_b00.node_count_ == 0) {
    local_b00.node = (&(local_b00.node)->back)[local_b00.reverse_ ^ 1];
    local_b00.node_count_ = (local_b00.node)->count + -1;
    local_b00.node_count_ref_ = local_b00.node_count_;
  }
  else {
    local_b00.node_count_ = local_b00.node_count_ + -1;
  }
  pbVar4 = ((local_b00.node)->valz).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,
                      pbVar4[(long)local_b00.node_count_ref_ - (long)local_b00.node_count_].
                      _M_dataplus._M_p,
                      pbVar4[(long)local_b00.node_count_ref_ - (long)local_b00.node_count_].
                      _M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Count: ",7);
  skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
  ::find((iterator *)local_b28,&local_a38,0x14);
  if ((local_b18 !=
       (SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0) || (iVar12 = 0, local_b28._0_4_ != 0)) {
    iVar12 = local_b18->count;
  }
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar12);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_ae8);
  skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
  ::~skiplist(&local_a38);
  return 0;
}

Assistant:

int main() {
  skiplist<int, std::string> aDict;

  aDict.insert(10, "hello");
  aDict.insert(20, "jello");
  aDict.insert(20, "yello");
  aDict.insert(40, "fello");

  std::cout << aDict;

  // foundit(aDict, DictKey{10});
  // foundit(aDict, DictKey{20});
  // foundit(aDict, DictKey{30});
  std::cout << "SKIPLIST:\n";
  for(auto e: aDict)
    std::cout << e << "\n";

  // same operations on multiset
  std::multimap<int, std::string> lolz;
  lolz.insert({10, "hello"});
  lolz.insert({20, "jello"});
  lolz.insert({20, "yello"});
  lolz.insert({40, "fello"});

  std::cout << "MULTISET:\n";
  for(auto e: lolz)
    std::cout << e.first << ":" << e.second << "\n";

  // what about a find?
  // returns the first element inserted apparently
  std::cout << "MULTISET:\n";
  auto it = lolz.find(20);
  std::cout << "Found: " << it->first << ":" << it->second << "\n";
  auto next = ++it;
  std::cout << "Next: " << next->first << ":" << next->second << "\n";
  std::cout << "Count: " << lolz.count(20) << "\n";

  // now to repeat it with our data structure
  std::cout << "SKIPLIST:\n";
  auto iter = aDict.find(20);
  std::cout << "Found: " << *iter << "\n";
  std::cout << "Next: " << *++iter << "\n";
  std::cout << "Count: " << aDict.count(20) << "\n";

  return 0;
}